

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GLES2ThreadTest::CopyTexSubImage2D::CopyTexSubImage2D
          (CopyTexSubImage2D *this,SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,
          GLint level,GLint xoffset,GLint yoffset,GLint x,GLint y,GLsizei width,GLsizei height,
          bool useSync,bool serverSync)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  Texture *pTVar3;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_60;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_50;
  GLsizei local_3c;
  GLint local_38;
  GLint local_34;
  
  local_3c = height;
  local_38 = yoffset;
  local_34 = x;
  Operation::Operation(&this->super_Operation,"CopyTexSubImage2D",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__CopyTexSubImage2D_02118a88;
  local_60.m_ptr = &texture->m_ptr->super_Object;
  (this->m_texture).m_ptr = (Texture *)local_60.m_ptr;
  pSVar2 = texture->m_state;
  (this->m_texture).m_state = pSVar2;
  if (pSVar2 == (SharedPtrStateBase *)0x0) {
    local_60.m_state = (SharedPtrStateBase *)0x0;
  }
  else {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_texture).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
    local_60.m_ptr = &((this->m_texture).m_ptr)->super_Object;
    local_60.m_state = (this->m_texture).m_state;
  }
  this->m_level = level;
  this->m_xoffset = xoffset;
  this->m_yoffset = local_38;
  this->m_x = local_34;
  this->m_y = y;
  this->m_width = width;
  this->m_height = local_3c;
  if (local_60.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_60.m_state)->strongRefCount = (local_60.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_60.m_state)->weakRefCount = (local_60.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_60);
  pSVar2 = local_60.m_state;
  if (local_60.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_60.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_60.m_ptr = (Object *)0x0;
      (*(local_60.m_state)->_vptr_SharedPtrStateBase[2])(local_60.m_state);
    }
    LOCK();
    pdVar1 = &pSVar2->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_60.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_60.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_60.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pTVar3 = (this->m_texture).m_ptr;
  local_50.m_ptr = &((pTVar3->sourceImage).m_ptr)->super_Object;
  if ((EGLImage *)local_50.m_ptr != (EGLImage *)0x0) {
    local_50.m_state = (pTVar3->sourceImage).m_state;
    if (local_50.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_50.m_state)->strongRefCount = (local_50.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_50.m_state)->weakRefCount = (local_50.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    Operation::modifyGLObject(&this->super_Operation,&local_50);
    pSVar2 = local_50.m_state;
    if (local_50.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_50.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_50.m_ptr = (Object *)0x0;
        (*(local_50.m_state)->_vptr_SharedPtrStateBase[2])(local_50.m_state);
      }
      LOCK();
      pdVar1 = &pSVar2->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_50.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_50.m_state)->_vptr_SharedPtrStateBase[1])();
        return;
      }
    }
  }
  return;
}

Assistant:

CopyTexSubImage2D::CopyTexSubImage2D (SharedPtr<Texture> texture, GLint level, GLint xoffset, GLint yoffset, GLint x, GLint y, GLsizei width, GLsizei height, bool useSync, bool serverSync)
	: Operation		("CopyTexSubImage2D", useSync, serverSync)
	, m_texture		(texture)
	, m_level		(level)
	, m_xoffset		(xoffset)
	, m_yoffset		(yoffset)
	, m_x			(x)
	, m_y			(y)
	, m_width		(width)
	, m_height		(height)
{
	modifyGLObject(SharedPtr<Object>(m_texture));

	if (m_texture->sourceImage)
		modifyGLObject(SharedPtr<Object>(m_texture->sourceImage));
}